

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeJD(DateTime *p)

{
  int iVar1;
  long *in_RDI;
  int X2;
  int X1;
  int B;
  int A;
  int D;
  int M;
  int Y;
  int local_14;
  int local_10;
  int local_c;
  
  if ((char)in_RDI[5] == '\0') {
    if (*(char *)((long)in_RDI + 0x29) == '\0') {
      local_c = 2000;
      local_10 = 1;
      local_14 = 1;
    }
    else {
      local_c = (int)in_RDI[1];
      local_10 = *(int *)((long)in_RDI + 0xc);
      local_14 = (int)in_RDI[2];
    }
    if (((local_c < -0x1269) || (9999 < local_c)) || ((*(byte *)((long)in_RDI + 0x2c) & 1) != 0)) {
      datetimeError((DateTime *)0x22cada);
    }
    else {
      if (local_10 < 3) {
        local_c = local_c + -1;
        local_10 = local_10 + 0xc;
      }
      iVar1 = (local_c + 0x12c0) / 100;
      *in_RDI = (long)(((double)(((local_c + 0x126c) * 0x8ead) / 100 +
                                 ((local_10 + 1) * 0x4ab51) / 10000 + local_14 +
                                (0x26 - iVar1) + iVar1 / 4) - 1524.5) * 86400000.0);
      *(undefined1 *)(in_RDI + 5) = 1;
      if ((*(char *)((long)in_RDI + 0x2a) != '\0') &&
         (*in_RDI = (long)(*(int *)((long)in_RDI + 0x14) * 3600000 + (int)in_RDI[3] * 60000) +
                    (long)((double)in_RDI[4] * 1000.0 + 0.5) + *in_RDI,
         *(int *)((long)in_RDI + 0x1c) != 0)) {
        *in_RDI = *in_RDI - (long)(*(int *)((long)in_RDI + 0x1c) * 60000);
        *(undefined1 *)((long)in_RDI + 0x29) = 0;
        *(undefined1 *)((long)in_RDI + 0x2a) = 0;
        *(undefined4 *)((long)in_RDI + 0x1c) = 0;
        *(byte *)((long)in_RDI + 0x2c) = *(byte *)((long)in_RDI + 0x2c) & 0xf7 | 8;
        *(byte *)((long)in_RDI + 0x2c) = *(byte *)((long)in_RDI + 0x2c) & 0xef;
      }
    }
  }
  return;
}

Assistant:

static void computeJD(DateTime *p){
  int Y, M, D, A, B, X1, X2;

  if( p->validJD ) return;
  if( p->validYMD ){
    Y = p->Y;
    M = p->M;
    D = p->D;
  }else{
    Y = 2000;  /* If no YMD specified, assume 2000-Jan-01 */
    M = 1;
    D = 1;
  }
  if( Y<-4713 || Y>9999 || p->rawS ){
    datetimeError(p);
    return;
  }
  if( M<=2 ){
    Y--;
    M += 12;
  }
  A = (Y+4800)/100;
  B = 38 - A + (A/4);
  X1 = 36525*(Y+4716)/100;
  X2 = 306001*(M+1)/10000;
  p->iJD = (sqlite3_int64)((X1 + X2 + D + B - 1524.5 ) * 86400000);
  p->validJD = 1;
  if( p->validHMS ){
    p->iJD += p->h*3600000 + p->m*60000 + (sqlite3_int64)(p->s*1000 + 0.5);
    if( p->tz ){
      p->iJD -= p->tz*60000;
      p->validYMD = 0;
      p->validHMS = 0;
      p->tz = 0;
      p->isUtc = 1;
      p->isLocal = 0;
    }
  }
}